

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O1

string * __thiscall
enact::AstSerialise::visitInterpolationExpr_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,InterpolationExpr *expr)

{
  size_type *psVar1;
  StringExpr *pSVar2;
  Expr *pEVar3;
  undefined8 uVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  ulong uVar8;
  undefined1 *puVar9;
  long *local_e8;
  undefined8 local_e0;
  long local_d8;
  undefined8 uStack_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  ulong *local_a8;
  long local_a0;
  ulong local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  puVar9 = &this->field_0x8;
  pSVar2 = (expr->start)._M_t.
           super___uniq_ptr_impl<enact::StringExpr,_std::default_delete<enact::StringExpr>_>._M_t.
           super__Tuple_impl<0UL,_enact::StringExpr_*,_std::default_delete<enact::StringExpr>_>.
           super__Head_base<0UL,_enact::StringExpr_*,_false>._M_head_impl;
  (*(pSVar2->super_Expr)._vptr_Expr[2])(local_48,pSVar2,puVar9);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_48);
  puVar7 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar7) {
    local_b8 = *puVar7;
    uStack_b0 = (undefined4)plVar5[3];
    uStack_ac = *(undefined4 *)((long)plVar5 + 0x1c);
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *puVar7;
    local_c8 = (ulong *)*plVar5;
  }
  local_c0 = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  pEVar3 = (expr->interpolated)._M_t.
           super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
           super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
           super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (*pEVar3->_vptr_Expr[2])(&local_68,pEVar3,puVar9);
  uVar8 = 0xf;
  if (local_c8 != &local_b8) {
    uVar8 = local_b8;
  }
  if (uVar8 < (ulong)(local_60 + local_c0)) {
    uVar8 = 0xf;
    if (local_68 != local_58) {
      uVar8 = local_58[0];
    }
    if (uVar8 < (ulong)(local_60 + local_c0)) goto LAB_0011c0a5;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_c8);
  }
  else {
LAB_0011c0a5:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_68);
  }
  local_e8 = &local_d8;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_d8 = *plVar5;
    uStack_d0 = puVar6[3];
  }
  else {
    local_d8 = *plVar5;
    local_e8 = (long *)*puVar6;
  }
  local_e0 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_e8);
  puVar7 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar7) {
    local_98 = *puVar7;
    uStack_90 = (undefined4)plVar5[3];
    uStack_8c = *(undefined4 *)((long)plVar5 + 0x1c);
    local_a8 = &local_98;
  }
  else {
    local_98 = *puVar7;
    local_a8 = (ulong *)*plVar5;
  }
  local_a0 = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  pEVar3 = (expr->end)._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
           super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (*pEVar3->_vptr_Expr[2])(&local_88,pEVar3,puVar9);
  uVar8 = 0xf;
  if (local_a8 != &local_98) {
    uVar8 = local_98;
  }
  if (uVar8 < (ulong)(local_80 + local_a0)) {
    uVar8 = 0xf;
    if (local_88 != local_78) {
      uVar8 = local_78[0];
    }
    if ((ulong)(local_80 + local_a0) <= uVar8) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_a8);
      goto LAB_0011c1d8;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_88);
LAB_0011c1d8:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar1) {
    uVar4 = puVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitInterpolationExpr(InterpolationExpr &expr) {
        return visitExpr(*expr.start) + "\\(" + visitExpr(*expr.interpolated) + ")" + visitExpr(*expr.end);
    }